

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWArray.h
# Opt level: O0

void __thiscall
COLLADAFW::Array<COLLADAFW::UniqueId>::cloneArray
          (Array<COLLADAFW::UniqueId> *this,Array<COLLADAFW::UniqueId> *clonedArray)

{
  undefined4 uVar1;
  size_t count_00;
  UniqueId *pUVar2;
  UniqueId *pUVar3;
  Array<COLLADAFW::UniqueId> *in_RSI;
  Array<COLLADAFW::UniqueId> *in_RDI;
  size_t i;
  size_t count;
  ulong local_20;
  
  getCapacity(in_RDI);
  allocMemory(this,(size_t)clonedArray,count._4_4_);
  count_00 = getCount(in_RDI);
  setCount(in_RSI,count_00);
  for (local_20 = 0; local_20 < count_00; local_20 = local_20 + 1) {
    pUVar2 = operator[](in_RDI,local_20);
    pUVar3 = operator[](in_RSI,local_20);
    uVar1 = *(undefined4 *)&pUVar2->field_0x4;
    pUVar3->mClassId = pUVar2->mClassId;
    *(undefined4 *)&pUVar3->field_0x4 = uVar1;
    pUVar3->mObjectId = pUVar2->mObjectId;
    pUVar3->mFileId = pUVar2->mFileId;
  }
  return;
}

Assistant:

void cloneArray( Array<Type>& clonedArray ) const
		{
			clonedArray.allocMemory(getCapacity());
			size_t count = getCount();
			clonedArray.setCount(count);
			for ( size_t i = 0; i < count; ++i)
				clonedArray[i] = (*this)[i];
		}